

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::ldexp_invalid_x
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  ShaderFunction function;
  bool bVar1;
  char *__s;
  long lVar2;
  DataType in_stack_ffffffffffffff38;
  allocator<char> local_c1;
  long local_c0;
  long local_b8;
  string shaderSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderSource,"ldexp: Invalid x type.",(allocator<char> *)&local_90);
  NegativeTestContext::beginSection(ctx,&shaderSource);
  std::__cxx11::string::~string((string *)&shaderSource);
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    shaderType = (&(anonymous_namespace)::s_shaders)[lVar2];
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_c1);
      std::operator+(&shaderSource,"Verify shader: ",&local_90);
      local_c0 = lVar2;
      NegativeTestContext::beginSection(ctx,&shaderSource);
      std::__cxx11::string::~string((string *)&shaderSource);
      std::__cxx11::string::~string((string *)&local_90);
      for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
        function = *(ShaderFunction *)((long)&(anonymous_namespace)::s_intTypes + lVar2);
        local_b8 = lVar2;
        (anonymous_namespace)::genShaderSourceFrexpLdexp_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,9,function,function,
                   in_stack_ffffffffffffff38);
        std::__cxx11::string::string((string *)&local_50,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&shaderSource);
        lVar2 = local_b8;
        (anonymous_namespace)::genShaderSourceFrexpLdexp_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,9,
                   *(ShaderFunction *)((long)&(anonymous_namespace)::s_uintTypes + local_b8),
                   function,in_stack_ffffffffffffff38);
        std::__cxx11::string::string((string *)&local_70,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&shaderSource);
      }
      NegativeTestContext::endSection(ctx);
      lVar2 = local_c0;
    }
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void ldexp_invalid_x (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));

	ctx.beginSection("ldexp: Invalid x type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
			{
				{
					const std::string shaderSource(genShaderSourceFrexpLdexp(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_LDEXP, s_intTypes[dataTypeNdx], s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceFrexpLdexp(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_LDEXP, s_uintTypes[dataTypeNdx], s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}